

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O1

void __thiscall
agge::tests::VectorRasterizerTests::CellsAreSortedAfterCompacting(VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  FailedAssertion *this_00;
  long lVar3;
  undefined8 *puVar4;
  cell *pcVar5;
  byte bVar6;
  vector_rasterizer vr;
  cell reference [9];
  string local_168;
  LocationInfo local_148;
  string local_120;
  vector_rasterizer local_100;
  cell local_88 [8];
  undefined2 local_30;
  
  bVar6 = 0;
  vector_rasterizer::vector_rasterizer(&local_100);
  anon_unknown_6::rectangle(&local_100,2.0,1.0,5.0,5.0);
  vector_rasterizer::compact(&local_100);
  puVar4 = &DAT_001a3a00;
  pcVar5 = local_88;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar2 = *puVar4;
    pcVar5->x = (short)uVar2;
    pcVar5->y = (short)((ulong)uVar2 >> 0x10);
    pcVar5->area = (int)((ulong)uVar2 >> 0x20);
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    pcVar5 = (cell *)((long)pcVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  local_30 = 0;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_148,&local_120,0x5f7);
  if (local_100._sorted != 0) {
    paVar1 = &local_148.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_148,&local_168,0x5f8);
    ut::are_equal<agge::vector_rasterizer::cell,9ul,agge::pod_vector<agge::vector_rasterizer::cell>>
              ((cell (*) [9])local_88,&local_100._cells,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_148.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    if (local_100._x_sorted_cells._begin != (cell *)0x0) {
      operator_delete__(local_100._x_sorted_cells._begin);
    }
    if (local_100._histogram_x._begin != (uint *)0x0) {
      operator_delete__(local_100._histogram_x._begin);
    }
    if (local_100._histogram_y._begin != (uint *)0x0) {
      operator_delete__(local_100._histogram_y._begin);
    }
    if (local_100._cells._begin != (cell *)0x0) {
      operator_delete__(local_100._cells._begin);
    }
    return;
  }
  this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Value is not \'true\'!","");
  ut::FailedAssertion::FailedAssertion(this_00,&local_168,&local_148);
  __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( CellsAreSortedAfterCompacting )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				rectangle(vr, 2, 1, 5, 5);
				vr.compact();

				// ASSERT
				vector_rasterizer::cell reference[] = {
					{ 2, 1, 0, -256 }, { 5, 1, 0, 256 },
					{ 2, 2, 0, -256 }, { 5, 2, 0, 256 },
					{ 2, 3, 0, -256 }, { 5, 3, 0, 256 },
					{ 2, 4, 0, -256 }, { 5, 4, 0, 256 },
					{ 5, 5, 0, 0 },
				};

				assert_is_true(vr.sorted());
				assert_equal(reference, vr.cells());
			}